

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhsum.c
# Opt level: O1

Multihash XSUM_hashStream(FILE *inFile,AlgoSelected hashType,void *buffer,size_t blockSize)

{
  int iVar1;
  uint uVar2;
  size_t len;
  XXH64_hash_t XVar3;
  ulong uVar4;
  XXH128_hash_t XVar5;
  Multihash MVar6;
  XXH32_state_t state32;
  XXH64_state_t state64;
  XXH3_state_t state128;
  XXH32_state_t local_348;
  XXH64_state_t local_318;
  XXH3_state_t local_2c0;
  
  XXH32_reset(&local_348,0);
  XXH64_reset(&local_318,0);
  XXH3_128bits_reset(&local_2c0);
  len = fread(buffer,1,blockSize,(FILE *)inFile);
  if (len != 0) {
    do {
      if (hashType == algo_xxh128) {
        XXH3_128bits_update(&local_2c0,buffer,len);
      }
      else if (hashType == algo_xxh64) {
        XXH64_update(&local_318,buffer,len);
      }
      else if (hashType == algo_xxh32) {
        XXH32_update(&local_348,buffer,len);
      }
      len = fread(buffer,1,blockSize,(FILE *)inFile);
    } while (len != 0);
  }
  iVar1 = ferror((FILE *)inFile);
  if (iVar1 == 0) {
    if (hashType == algo_xxh128) {
      XVar5 = XXH3_128bits_digest(&local_2c0);
      uVar4 = XVar5.low64 & 0xffffffff00000000;
    }
    else if (hashType == algo_xxh64) {
      XVar3 = XXH64_digest(&local_318);
      uVar4 = XVar3 & 0xffffffff00000000;
      XVar5.high64 = 0;
      XVar5.low64 = XVar3;
    }
    else {
      if (hashType == algo_xxh32) {
        uVar2 = XXH32_digest(&local_348);
      }
      else {
        uVar2 = 0;
      }
      XVar5 = (XXH128_hash_t)ZEXT416(uVar2);
      uVar4 = 0;
    }
    MVar6._8_8_ = XVar5.high64;
    MVar6._0_8_ = (uint)XVar5.low64 | uVar4;
    return MVar6;
  }
  XSUM_log("Error: a failure occurred reading the input file.\n");
  exit(1);
}

Assistant:

static Multihash
XSUM_hashStream(FILE* inFile,
                AlgoSelected hashType,
                void* buffer, size_t blockSize)
{
    XXH32_state_t state32;
    XXH64_state_t state64;
    XXH3_state_t state128;

    /* Init */
    (void)XXH32_reset(&state32, XXHSUM32_DEFAULT_SEED);
    (void)XXH64_reset(&state64, XXHSUM64_DEFAULT_SEED);
    (void)XXH3_128bits_reset(&state128);

    /* Load file & update hash */
    {   size_t readSize;
        while ((readSize = fread(buffer, 1, blockSize, inFile)) > 0) {
            switch(hashType)
            {
            case algo_xxh32:
                (void)XXH32_update(&state32, buffer, readSize);
                break;
            case algo_xxh64:
                (void)XXH64_update(&state64, buffer, readSize);
                break;
            case algo_xxh128:
                (void)XXH3_128bits_update(&state128, buffer, readSize);
                break;
            default:
                assert(0);
            }
        }
        if (ferror(inFile)) {
            XSUM_log("Error: a failure occurred reading the input file.\n");
            exit(1);
    }   }

    {   Multihash finalHash = {0};
        switch(hashType)
        {
        case algo_xxh32:
            finalHash.xxh32 = XXH32_digest(&state32);
            break;
        case algo_xxh64:
            finalHash.xxh64 = XXH64_digest(&state64);
            break;
        case algo_xxh128:
            finalHash.xxh128 = XXH3_128bits_digest(&state128);
            break;
        default:
            assert(0);
        }
        return finalHash;
    }
}